

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::GLMRegressor::ByteSizeLong(GLMRegressor *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLMRegressor_PostEvaluationTransform GVar4;
  reference value;
  long lVar5;
  size_t sVar6;
  int cached_size;
  size_t data_size;
  uint count;
  GLMRegressor_DoubleArray *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  GLMRegressor *this_local;
  
  iVar2 = _internal_weights_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::
           begin(&this->weights_);
  msg = (GLMRegressor_DoubleArray *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::end
                  (&this->weights_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::
                 operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::operator*
                      (&__end2);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::GLMRegressor_DoubleArray>(value);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::operator++(&__end2);
  }
  uVar3 = _internal_offset_size(this);
  lVar5 = (ulong)uVar3 * 8;
  if ((ulong)uVar3 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  sStack_18 = lVar5 + sStack_18;
  GVar4 = _internal_postevaluationtransform(this);
  if (GVar4 != GLMRegressor_PostEvaluationTransform_NoTransform) {
    GVar4 = _internal_postevaluationtransform(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(GVar4);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_18 = lVar5 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t GLMRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  total_size += 1UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated double offset = 2;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_offset_size());
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->_internal_postevaluationtransform() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_postevaluationtransform());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}